

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_pcg_serial.c
# Opt level: O0

int PSolve(void *Data,N_Vector r_vec,N_Vector z_vec,sunrealtype tol,int lr)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  UserData *ProbData;
  sunindextype i;
  sunrealtype *s;
  sunrealtype *d;
  sunrealtype *z;
  sunrealtype *r;
  int in_stack_ffffffffffffff9c;
  void *in_stack_ffffffffffffffa8;
  long lVar6;
  int local_4;
  
  lVar2 = N_VGetArrayPointer(in_RSI);
  iVar1 = check_flag(in_stack_ffffffffffffffa8,(char *)in_RDI,in_stack_ffffffffffffff9c);
  if (iVar1 == 0) {
    lVar3 = N_VGetArrayPointer(in_RDX);
    iVar1 = check_flag(in_stack_ffffffffffffffa8,(char *)in_RDI,in_stack_ffffffffffffff9c);
    if (iVar1 == 0) {
      lVar4 = N_VGetArrayPointer(in_RDI[1]);
      iVar1 = check_flag(in_stack_ffffffffffffffa8,(char *)in_RDI,in_stack_ffffffffffffff9c);
      if (iVar1 == 0) {
        lVar5 = N_VGetArrayPointer(in_RDI[2]);
        iVar1 = check_flag(in_stack_ffffffffffffffa8,(char *)in_RDI,in_stack_ffffffffffffff9c);
        if (iVar1 == 0) {
          for (lVar6 = 0; lVar6 < *in_RDI; lVar6 = lVar6 + 1) {
            *(double *)(lVar3 + lVar6 * 8) =
                 (*(double *)(lVar5 + lVar6 * 8) * *(double *)(lVar5 + lVar6 * 8) *
                 *(double *)(lVar2 + lVar6 * 8)) / *(double *)(lVar4 + lVar6 * 8);
          }
          local_4 = 0;
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int PSolve(void* Data, N_Vector r_vec, N_Vector z_vec, sunrealtype tol, int lr)
{
  /* local variables */
  sunrealtype *r, *z, *d, *s;
  sunindextype i;
  UserData* ProbData;

  /* access user data structure and vector data */
  ProbData = (UserData*)Data;
  r        = N_VGetArrayPointer(r_vec);
  if (check_flag(r, "N_VGetArrayPointer", 0)) { return 1; }
  z = N_VGetArrayPointer(z_vec);
  if (check_flag(z, "N_VGetArrayPointer", 0)) { return 1; }
  d = N_VGetArrayPointer(ProbData->d);
  if (check_flag(d, "N_VGetArrayPointer", 0)) { return 1; }
  s = N_VGetArrayPointer(ProbData->s);
  if (check_flag(s, "N_VGetArrayPointer", 0)) { return 1; }

  /* iterate through domain, performing Jacobi solve */
  for (i = 0; i < ProbData->N; i++) { z[i] = s[i] * s[i] * r[i] / d[i]; }

  /* return with success */
  return 0;
}